

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O2

vector<field::GF2E,_std::allocator<field::GF2E>_> *
field::build_from_roots
          (vector<field::GF2E,_std::allocator<field::GF2E>_> *__return_storage_ptr__,
          vector<field::GF2E,_std::allocator<field::GF2E>_> *roots)

{
  GF2E GVar1;
  long lVar2;
  pointer this;
  long lVar3;
  size_t k;
  ulong uVar4;
  long lVar5;
  GF2E local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  lVar5 = (long)(roots->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(roots->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                super__Vector_impl_data._M_start;
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::vector(__return_storage_ptr__,roots);
  local_50.data = 0;
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::emplace_back<field::GF2E>
            (__return_storage_ptr__,&local_50);
  local_40 = lVar5 >> 3;
  lVar2 = 0;
  lVar3 = 0;
  local_48 = lVar5;
  for (uVar4 = 1;
      this = (__return_storage_ptr__->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)
             ._M_impl.super__Vector_impl_data._M_start, uVar4 < local_40; uVar4 = uVar4 + 1) {
    local_50.data = this[uVar4].data;
    this[uVar4].data = local_50.data ^ this[uVar4 - 1].data;
    lVar5 = lVar3;
    local_38 = lVar2;
    for (; lVar2 != 0; lVar2 = lVar2 + 1) {
      GVar1 = GF2E::operator*((GF2E *)((long)&this->data + lVar5),&local_50);
      this = (__return_storage_ptr__->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)
             ._M_impl.super__Vector_impl_data._M_start;
      *(uint64_t *)((long)&this->data + lVar5) =
           GVar1.data ^ *(ulong *)((long)&this[-1].data + lVar5);
      lVar5 = lVar5 + -8;
    }
    GF2E::operator*=(this,&local_50);
    lVar3 = lVar3 + 8;
    lVar2 = local_38 + -1;
  }
  *(undefined8 *)((long)&this->data + local_48) = 1;
  return __return_storage_ptr__;
}

Assistant:

std::vector<GF2E> build_from_roots(const std::vector<GF2E> &roots) {
  size_t len = roots.size();

  std::vector<GF2E> poly(roots);
  poly.push_back(GF2E(0));

  GF2E tmp;
  for (size_t k = 1; k < len; k++) {
    tmp = poly[k];
    poly[k] = tmp + poly[k - 1];
    for (size_t i = k - 1; i >= 1; i--) {
      poly[i] = poly[i] * tmp + poly[i - 1];
    }
    poly[0] *= tmp;
  }
  poly[len] = GF2E(1);
  return poly;
}